

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.h
# Opt level: O0

void __thiscall
slang::ast::RandCaseStatement::visitExprs<register_has_no_reset::AlwaysFFVisitor&>
          (RandCaseStatement *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  long in_RDI;
  Item *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *__range3;
  AlwaysFFVisitor *in_stack_ffffffffffffffc8;
  Expression *in_stack_ffffffffffffffd0;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *in_stack_ffffffffffffffd8
  ;
  __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
  local_20;
  long local_18;
  
  local_18 = in_RDI + 0x20;
  local_20._M_current =
       (Item *)std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *
                          )in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
         ::operator*(&local_20);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x24dfea);
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::RandCaseStatement::Item_*,_std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& item : items)
            item.expr->visit(visitor);
    }